

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

string * __thiscall
cmCPackGenerator::FindTemplate_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackGenerator *this,char *name)

{
  cmCPackLog *pcVar1;
  ostream *poVar2;
  char *pcVar3;
  char *local_398;
  string local_368 [32];
  undefined1 local_348 [8];
  ostringstream cmCPackLog_msg_1;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream cmCPackLog_msg;
  char *name_local;
  cmCPackGenerator *this_local;
  string *ffile;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = std::operator<<((ostream *)local_198,"Look for template: ");
  local_398 = name;
  if (name == (char *)0x0) {
    local_398 = "(NULL)";
  }
  poVar2 = std::operator<<(poVar2,local_398);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->Logger;
  std::__cxx11::ostringstream::str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x504,pcVar3);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  cmMakefile::GetModulesFile_abi_cxx11_(__return_storage_ptr__,this->MakefileMap,name);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
  poVar2 = std::operator<<((ostream *)local_348,"Found template: ");
  poVar2 = std::operator<<(poVar2,(string *)__return_storage_ptr__);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->Logger;
  std::__cxx11::ostringstream::str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x507,pcVar3);
  std::__cxx11::string::~string(local_368);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackGenerator::FindTemplate(const char* name)
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Look for template: "
    << (name ? name : "(NULL)") << std::endl);
  std::string ffile = this->MakefileMap->GetModulesFile(name);
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Found template: "
    << ffile << std::endl);
  return ffile;
}